

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_package_fake.hxx
# Opt level: O0

void __thiscall RaftPkg::~RaftPkg(RaftPkg *this)

{
  bool bVar1;
  element_type *peVar2;
  logger_wrapper *in_RDI;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI[7].my_log_);
  if (bVar1) {
    std::__shared_ptr_access<logger_wrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<logger_wrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x122930);
    logger_wrapper::destroy(in_RDI);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI[3].my_log_);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x12295e);
    (*(peVar2->super_rpc_client_factory)._vptr_rpc_client_factory[5])();
  }
  std::shared_ptr<nuraft::raft_server>::~shared_ptr((shared_ptr<nuraft::raft_server> *)0x12297f);
  std::shared_ptr<nuraft::delayed_task_scheduler>::~shared_ptr
            ((shared_ptr<nuraft::delayed_task_scheduler> *)0x122990);
  std::shared_ptr<nuraft::rpc_client_factory>::~shared_ptr
            ((shared_ptr<nuraft::rpc_client_factory> *)0x1229a1);
  std::shared_ptr<nuraft::rpc_listener>::~shared_ptr((shared_ptr<nuraft::rpc_listener> *)0x1229b2);
  std::shared_ptr<nuraft::logger>::~shared_ptr((shared_ptr<nuraft::logger> *)0x1229c3);
  std::shared_ptr<logger_wrapper>::~shared_ptr((shared_ptr<logger_wrapper> *)0x1229d1);
  std::shared_ptr<nuraft::state_machine>::~shared_ptr((shared_ptr<nuraft::state_machine> *)0x1229df)
  ;
  std::shared_ptr<nuraft::state_mgr>::~shared_ptr((shared_ptr<nuraft::state_mgr> *)0x1229ed);
  std::shared_ptr<nuraft::FakeTimer>::~shared_ptr((shared_ptr<nuraft::FakeTimer> *)0x1229fb);
  std::shared_ptr<nuraft::FakeNetwork>::~shared_ptr((shared_ptr<nuraft::FakeNetwork> *)0x122a09);
  std::shared_ptr<nuraft::FakeNetworkBase>::~shared_ptr
            ((shared_ptr<nuraft::FakeNetworkBase> *)0x122a17);
  std::__cxx11::string::~string((string *)&in_RDI->my_log_);
  return;
}

Assistant:

~RaftPkg() {
        if (myLogWrapper) myLogWrapper->destroy();
        if (fNet) fNet->shutdown();
    }